

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::InferredValueFunction::~InferredValueFunction(InferredValueFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~InferredValueFunction((InferredValueFunction *)0x1364e28);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

InferredValueFunction(KnownSystemName knownNameId, bool isClockFunc) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isClockFunc(isClockFunc) {}